

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall capnp::compiler::Compiler::Node::loadFinalSchema(Node *this,SchemaLoader *loader)

{
  int iVar1;
  Exception *in_RCX;
  StringPtr error;
  Content *content;
  Runnable local_2f0;
  undefined1 *local_2e8;
  SchemaLoader *local_2e0;
  Node *local_2d8;
  NullableValue<kj::Exception> local_2d0;
  NullableValue<kj::Exception> exception;
  
  content = (Content *)getContent(this,FINISHED);
  if (content != (Content *)0x0) {
    local_2f0._vptr_Runnable = (_func_int **)&PTR_run_003092f0;
    local_2e8 = (undefined1 *)&content;
    local_2e0 = loader;
    local_2d8 = this;
    kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_2d0,&local_2f0);
    kj::_::NullableValue<kj::Exception>::NullableValue(&exception,&local_2d0);
    kj::_::NullableValue<kj::Exception>::~NullableValue(&local_2d0);
    if (exception.isSet == true) {
      if ((content->finalSchema).ptr.isSet == true) {
        (content->finalSchema).ptr.isSet = false;
      }
      iVar1 = (*(this->module->parserModule->super_ErrorReporter)._vptr_ErrorReporter[1])();
      if ((char)iVar1 == '\0') {
        kj::str<char_const(&)[50],kj::Exception&>
                  ((String *)&local_2d0,(kj *)"Internal compiler bug: Schema failed validation:\n",
                   (char (*) [50])&exception.field_1,in_RCX);
        if (local_2d0.field_1.value.ownFile.content.ptr == (char *)0x0) {
          local_2d0._0_8_ = "";
        }
        error.content.size_ =
             local_2d0.field_1.value.ownFile.content.ptr +
             (local_2d0.field_1.value.ownFile.content.ptr == (char *)0x0);
        error.content.ptr = (char *)local_2d0._0_8_;
        addError(this,error);
        kj::Array<char>::~Array((Array<char> *)&local_2d0);
      }
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue(&exception);
  }
  return;
}

Assistant:

void Compiler::Node::loadFinalSchema(const SchemaLoader& loader) {
  KJ_IF_MAYBE(content, getContent(Content::FINISHED)) {
    KJ_IF_MAYBE(exception, kj::runCatchingExceptions([&](){
      KJ_IF_MAYBE(finalSchema, content->finalSchema) {
        KJ_MAP(auxSchema, content->auxSchemas) {
          return loader.loadOnce(auxSchema);
        };
        loadedFinalSchema = loader.loadOnce(*finalSchema).getProto();
      }
    })) {
      // Schema validation threw an exception.

      // Don't try loading this again.
      content->finalSchema = nullptr;

      // Only bother to report validation failures if we think we haven't seen any errors.
      // Otherwise we assume that the errors caused the validation failure.
      if (!module->getErrorReporter().hadErrors()) {
        addError(kj::str("Internal compiler bug: Schema failed validation:\n", *exception));
      }
    }
  }
}